

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle-vulkan.c
# Opt level: O0

void demo_create_window(demo *demo)

{
  GLFWwindow *pGVar1;
  demo *demo_local;
  
  glfwWindowHint(0x22001,0);
  pGVar1 = glfwCreateWindow(demo->width,demo->height,"The Vulkan Triangle Demo Program",
                            (GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  demo->window = pGVar1;
  if (demo->window == (GLFWwindow *)0x0) {
    printf("Cannot create a window in which to draw!\n");
    fflush(_stdout);
    exit(1);
  }
  glfwSetWindowUserPointer(demo->window,demo);
  glfwSetWindowRefreshCallback(demo->window,demo_refresh_callback);
  glfwSetFramebufferSizeCallback(demo->window,demo_resize_callback);
  glfwSetKeyCallback(demo->window,demo_key_callback);
  return;
}

Assistant:

static void demo_create_window(struct demo *demo) {
    glfwWindowHint(GLFW_CLIENT_API, GLFW_NO_API);

    demo->window = glfwCreateWindow(demo->width,
                                    demo->height,
                                    APP_LONG_NAME,
                                    NULL,
                                    NULL);
    if (!demo->window) {
        // It didn't work, so try to give a useful error:
        printf("Cannot create a window in which to draw!\n");
        fflush(stdout);
        exit(1);
    }

    glfwSetWindowUserPointer(demo->window, demo);
    glfwSetWindowRefreshCallback(demo->window, demo_refresh_callback);
    glfwSetFramebufferSizeCallback(demo->window, demo_resize_callback);
    glfwSetKeyCallback(demo->window, demo_key_callback);
}